

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_24::BinaryReader::ReadTargetFeaturesSections
          (BinaryReader *this,Offset section_size)

{
  bool bVar1;
  Result RVar2;
  undefined1 local_48 [8];
  string_view name;
  uint8_t prefix;
  uint32_t local_28;
  Enum local_24;
  uint32_t count;
  Offset section_size_local;
  BinaryReader *this_local;
  
  _count = section_size;
  section_size_local = (Offset)this;
  local_24 = (*this->delegate_->_vptr_BinaryReaderDelegate[0xbf])(this->delegate_,section_size);
  bVar1 = Succeeded((Result)local_24);
  if (bVar1) {
    RVar2 = ReadU32Leb128(this,&local_28,"sym count");
    bVar1 = Failed(RVar2);
    if (bVar1) {
      Result::Result((Result *)((long)&this_local + 4),Error);
    }
    else {
      RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc0])();
      bVar1 = Succeeded(RVar2);
      if (bVar1) {
        do {
          if (local_28 == 0) {
            local_28 = local_28 - 1;
            RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc2])();
            bVar1 = Succeeded(RVar2);
            if (!bVar1) {
              PrintError(this,"EndTargetFeaturesSection callback failed");
              Result::Result((Result *)((long)&this_local + 4),Error);
              return (Result)this_local._4_4_;
            }
            Result::Result((Result *)((long)&this_local + 4),Ok);
            return (Result)this_local._4_4_;
          }
          local_28 = local_28 - 1;
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_48);
          RVar2 = ReadU8(this,(uint8_t *)((long)&name._M_str + 7),"prefix");
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2 = ReadStr(this,(string_view *)local_48,"feature name");
          bVar1 = Failed(RVar2);
          if (bVar1) {
            Result::Result((Result *)((long)&this_local + 4),Error);
            return (Result)this_local._4_4_;
          }
          RVar2.enum_ = (*this->delegate_->_vptr_BinaryReaderDelegate[0xc1])
                                  (this->delegate_,(ulong)name._M_str._7_1_,local_48,name._M_len);
          bVar1 = Succeeded(RVar2);
        } while (bVar1);
        PrintError(this,"OnFeature callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
      else {
        PrintError(this,"OnFeatureCount callback failed");
        Result::Result((Result *)((long)&this_local + 4),Error);
      }
    }
  }
  else {
    PrintError(this,"BeginTargetFeaturesSection callback failed");
    Result::Result((Result *)((long)&this_local + 4),Error);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result BinaryReader::ReadTargetFeaturesSections(Offset section_size) {
  CALLBACK(BeginTargetFeaturesSection, section_size);
  uint32_t count;
  CHECK_RESULT(ReadU32Leb128(&count, "sym count"));
  CALLBACK(OnFeatureCount, count);
  while (count--) {
    uint8_t prefix;
    std::string_view name;
    CHECK_RESULT(ReadU8(&prefix, "prefix"));
    CHECK_RESULT(ReadStr(&name, "feature name"));
    CALLBACK(OnFeature, prefix, name);
  }
  CALLBACK0(EndTargetFeaturesSection);
  return Result::Ok;
}